

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void RawWrite(RawFD fd,char *buf,size_t len)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t r;
  size_t len_local;
  char *buf_local;
  RawFD fd_local;
  
  r = len;
  len_local = (size_t)buf;
  while( true ) {
    if (r == 0) {
      return;
    }
    do {
      sVar1 = write(fd,(void *)len_local,r);
      bVar3 = false;
      if (sVar1 < 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (sVar1 < 1) break;
    len_local = sVar1 + len_local;
    r = r - sVar1;
  }
  return;
}

Assistant:

void RawWrite(RawFD fd, const char* buf, size_t len) {
  while (len > 0) {
    ssize_t r;
    NO_INTR(r = write(fd, buf, len));
    if (r <= 0) break;
    buf += r;
    len -= r;
  }
}